

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O0

void CMU462::Misc::init_mesh(void)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  uint i01;
  uint i11;
  uint i10;
  uint i00;
  uint *iptr;
  int j_1;
  int i_1;
  double sinlat;
  double *vptr;
  double lon;
  double lat;
  int j;
  int i;
  
  for (lat._4_4_ = 0; lat._4_4_ < 0x51; lat._4_4_ = lat._4_4_ + 1) {
    for (lat._0_4_ = 0; lat._0_4_ < 0x65; lat._0_4_ = lat._0_4_ + 1) {
      lVar3 = (long)((lat._4_4_ * 0x65 + lat._0_4_) * 8);
      Vertices[lVar3] = (double)lat._0_4_ / 100.0;
      Vertices[lVar3 + 1] = 1.0 - (double)lat._4_4_ / 80.0;
      dVar4 = ((double)lat._4_4_ / 80.0) * 3.141592653589793;
      __x = ((double)lat._0_4_ / 100.0) * 6.283185307179586;
      dVar5 = sin(dVar4);
      dVar6 = sin(__x);
      Vertices[lVar3 + 5] = dVar5 * dVar6;
      Vertices[lVar3 + 2] = dVar5 * dVar6;
      dVar4 = cos(dVar4);
      Vertices[lVar3 + 6] = dVar4;
      Vertices[lVar3 + 3] = dVar4;
      dVar4 = cos(__x);
      Vertices[lVar3 + 7] = dVar5 * dVar4;
      Vertices[lVar3 + 4] = dVar5 * dVar4;
    }
  }
  for (iptr._4_4_ = 0; iptr._4_4_ < 0x50; iptr._4_4_ = iptr._4_4_ + 1) {
    for (iptr._0_4_ = 0; (int)iptr < 100; iptr._0_4_ = (int)iptr + 1) {
      lVar3 = (long)((iptr._4_4_ * 100 + (int)iptr) * 6);
      uVar1 = iptr._4_4_ * 0x65 + (int)iptr;
      uVar2 = (iptr._4_4_ + 1) * 0x65 + (int)iptr + 1;
      Indices[lVar3] = uVar1;
      Indices[lVar3 + 1] = (iptr._4_4_ + 1) * 0x65 + (int)iptr;
      Indices[lVar3 + 2] = uVar2;
      Indices[lVar3 + 3] = uVar2;
      Indices[lVar3 + 4] = iptr._4_4_ * 0x65 + (int)iptr + 1;
      Indices[lVar3 + 5] = uVar1;
    }
  }
  return;
}

Assistant:

void init_mesh() {
  for ( int i = 0; i <= SPHERE_NUM_LAT; i++ ) {
    for ( int j = 0; j <= SPHERE_NUM_LON; j++ ) {
      double lat = ((double)i) / SPHERE_NUM_LAT;
      double lon = ((double)j) / SPHERE_NUM_LON;
      double *vptr = &Vertices[VERTEX_SIZE * SINDEX(i,j)];

      vptr[TCOORD_OFFSET + 0] = lon;
      vptr[TCOORD_OFFSET + 1] = 1-lat;

      lat *= PI;
      lon *= 2 * PI;
      double sinlat = sin( lat );

      vptr[NORMAL_OFFSET + 0] = vptr[VERTEX_OFFSET + 0] = sinlat * sin(lon);
      vptr[NORMAL_OFFSET + 1] = vptr[VERTEX_OFFSET + 1] = cos(lat),
      vptr[NORMAL_OFFSET + 2] = vptr[VERTEX_OFFSET + 2] = sinlat * cos(lon);
    }
  }

  for ( int i = 0; i < SPHERE_NUM_LAT; i++ ) {
    for ( int j = 0; j < SPHERE_NUM_LON; j++ ) {
      unsigned int* iptr = &Indices[6 * ( SPHERE_NUM_LON * i + j )];

      unsigned int i00 = SINDEX(i,  j  );
      unsigned int i10 = SINDEX(i+1,j  );
      unsigned int i11 = SINDEX(i+1,j+1);
      unsigned int i01 = SINDEX(i,  j+1);

      iptr[0] = i00;
      iptr[1] = i10;
      iptr[2] = i11;
      iptr[3] = i11;
      iptr[4] = i01;
      iptr[5] = i00;
    }
  }
}